

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::DescriptorScriptPubKeyMan::AddCryptedKey
          (DescriptorScriptPubKeyMan *this,CKeyID *key_id,CPubKey *pubkey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *crypted_key)

{
  size_t sVar1;
  mapped_type *pmVar2;
  long lVar3;
  undefined8 *puVar4;
  mapped_type *pmVar5;
  long in_FS_OFFSET;
  byte bVar6;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  unique_lock<std::recursive_mutex> local_a0;
  undefined8 local_90 [8];
  uchar local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  long local_30;
  
  bVar6 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_a0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_a0);
  sVar1 = (this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0) {
    memcpy(local_90,pubkey,0x41);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48,crypted_key);
    pmVar2 = std::
             map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ::operator[](&this->m_map_crypted_keys,key_id);
    puVar4 = local_90;
    pmVar5 = pmVar2;
    for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)(pmVar5->first).vch = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      pmVar5 = (mapped_type *)((long)pmVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    (pmVar2->first).vch[0x40] = local_50;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&pmVar2->second,&local_48);
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return sVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::AddCryptedKey(const CKeyID& key_id, const CPubKey& pubkey, const std::vector<unsigned char>& crypted_key)
{
    LOCK(cs_desc_man);
    if (!m_map_keys.empty()) {
        return false;
    }

    m_map_crypted_keys[key_id] = make_pair(pubkey, crypted_key);
    return true;
}